

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# refine_peaks.cpp
# Opt level: O1

void trt_pose::parse::refine_peaks_out_hw
               (float *refined_peaks,int *counts,int *peaks,float *cmap,int H,int W,int M,
               int window_size)

{
  float fVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  int jj;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  iVar2 = *counts;
  if (0 < (long)iVar2) {
    iVar5 = window_size / 2;
    lVar6 = 0;
    do {
      (refined_peaks + lVar6 * 2)[0] = 0.0;
      (refined_peaks + lVar6 * 2)[1] = 0.0;
      iVar3 = peaks[lVar6 * 2];
      iVar11 = iVar3 - iVar5;
      fVar13 = 0.0;
      if (iVar11 <= iVar5 + iVar3) {
        iVar4 = peaks[lVar6 * 2 + 1];
        do {
          if (iVar4 - iVar5 <= iVar4 + iVar5) {
            iVar10 = (H * 2 + -2) - iVar11;
            if (iVar11 < H) {
              iVar10 = iVar11;
            }
            if (iVar11 < 0) {
              iVar10 = -iVar11;
            }
            fVar14 = refined_peaks[lVar6 * 2];
            fVar15 = refined_peaks[lVar6 * 2 + 1];
            iVar9 = iVar5 - iVar4;
            iVar8 = iVar5 * 2 + 1;
            iVar7 = iVar4 - iVar5;
            do {
              iVar12 = W * 2 + -2 + iVar9;
              if (iVar7 < W) {
                iVar12 = iVar7;
              }
              if (iVar7 < 0) {
                iVar12 = iVar9;
              }
              fVar1 = cmap[iVar12 + iVar10 * W];
              fVar13 = fVar13 + fVar1;
              fVar14 = fVar14 + fVar1 * (float)iVar11;
              refined_peaks[lVar6 * 2] = fVar14;
              fVar15 = fVar15 + (float)iVar7 * fVar1;
              refined_peaks[lVar6 * 2 + 1] = fVar15;
              iVar7 = iVar7 + 1;
              iVar9 = iVar9 + -1;
              iVar8 = iVar8 + -1;
            } while (iVar8 != 0);
          }
          iVar11 = iVar11 + 1;
        } while (iVar11 != iVar3 + iVar5 + 1);
      }
      fVar14 = refined_peaks[lVar6 * 2 + 1];
      refined_peaks[lVar6 * 2] = (refined_peaks[lVar6 * 2] / fVar13 + 0.5) / (float)H;
      refined_peaks[lVar6 * 2 + 1] = (fVar14 / fVar13 + 0.5) / (float)W;
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar2);
  }
  return;
}

Assistant:

void refine_peaks_out_hw(float *refined_peaks, // Mx2
                         const int *counts,    // 1
                         const int *peaks,     // Mx2
                         const float *cmap,    // HxW
                         const int H, const int W, const int M,
                         const int window_size) {
  int count = *counts;
  int win = window_size / 2;

  for (int m = 0; m < count; m++) {
    float *refined_peak = &refined_peaks[m * 2];
    refined_peak[0] = 0.;
    refined_peak[1] = 0.;
    const int *peak = &peaks[m * 2];

    int i = peak[0];
    int j = peak[1];
    float weight_sum = 0.;

    for (int ii = i - win; ii < i + win + 1; ii++) {
      int ii_idx = reflect(ii, 0, H);
      for (int jj = j - win; jj < j + win + 1; jj++) {
        int jj_idx = reflect(jj, 0, W);

        float weight = cmap[ii_idx * W + jj_idx];
        refined_peak[0] += weight * ii;
        refined_peak[1] += weight * jj;
        weight_sum += weight;
      }
    }

    refined_peak[0] /= weight_sum;
    refined_peak[1] /= weight_sum;
    refined_peak[0] += 0.5; // center pixel
    refined_peak[1] += 0.5; // center pixel
    refined_peak[0] /= H;   // normalize coordinates
    refined_peak[1] /= W;   // normalize coordinates
  }
}